

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * matchimm(disctx *ctx,bitfield *bf,int spos)

{
  match *res;
  int iVar1;
  matches *__ptr;
  
  if (ctx->line->atomsnum != spos) {
    __ptr = alwaysmatches(spos + 1);
    res = __ptr->m;
    iVar1 = setbfe(res,bf,ctx->line->atoms[spos]);
    if (iVar1 != 0) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *matchimm (struct disctx *ctx, const struct bitfield *bf, int spos) {
	if (spos == ctx->line->atomsnum)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	if (setbfe(res->m, bf, ctx->line->atoms[spos]))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}